

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_map.hpp
# Opt level: O0

pair<pstore::index::details::index_pointer,_bool> __thiscall
pstore::index::
hamt_map<std::__cxx11::string,pstore::extent<char>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>
::insert_node<std::pair<std::__cxx11::string,pstore::extent<char>>>
          (hamt_map<std::__cxx11::string,pstore::extent<char>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>
           *this,transaction_base *transaction,index_pointer node,
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>
          *value,hash_type hash,uint shifts,
          not_null<pstore::array_stack<pstore::index::details::parent_type,_13UL>_*> parents,
          bool is_upsert)

{
  bool bVar1;
  database *db;
  array_stack<pstore::index::details::parent_type,_13UL> *this_00;
  size_t sVar2;
  pair<pstore::index::details::index_pointer,_bool> pVar3;
  index_pointer local_158 [2];
  index_pointer local_148;
  undefined1 local_140;
  hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_138;
  array_stack<pstore::index::details::parent_type,_13UL> *local_130;
  index_pointer local_128;
  undefined1 local_120;
  index_pointer local_118 [2];
  index_pointer local_108;
  undefined1 local_100;
  hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_f8;
  array_stack<pstore::index::details::parent_type,_13UL> *local_f0;
  index_pointer local_e8;
  undefined1 local_e0;
  hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_d8;
  index_pointer local_d0;
  ulong local_c8;
  hash_type existing_hash;
  parent_type local_b8;
  hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_a8;
  address local_a0 [3];
  value_type local_88;
  undefined1 local_80 [8];
  key_type existing_key;
  index_pointer iStack_58;
  bool key_exists;
  index_pointer result;
  bool is_upsert_local;
  hash_type hStack_48;
  uint shifts_local;
  hash_type hash_local;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>
  *value_local;
  transaction_base *transaction_local;
  hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_local;
  not_null<pstore::array_stack<pstore::index::details::parent_type,_13UL>_*> parents_local;
  index_pointer node_local;
  
  this_local = (hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)parents.ptr_;
  result.addr_.a_._3_1_ = is_upsert;
  result.addr_.a_._4_4_ = shifts;
  hStack_48 = hash;
  hash_local = (hash_type)value;
  value_local = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>
                 *)transaction;
  transaction_local = (transaction_base *)this;
  parents_local.ptr_ = (array_stack<pstore::index::details::parent_type,_13UL> *)node;
  details::index_pointer::index_pointer((index_pointer *)&stack0xffffffffffffffa8);
  existing_key.field_2._M_local_buf[0xf] = '\0';
  bVar1 = details::index_pointer::is_leaf((index_pointer *)&parents_local);
  if (bVar1) {
    db = transaction_base::db((transaction_base *)value_local);
    local_88 = (value_type)details::index_pointer::to_address((index_pointer *)&parents_local);
    hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::get_key((key_type *)local_80,
              (hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)this,db,(address)local_88);
    bVar1 = std::
            equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)(this + 0x29),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         hash_local,(key_type *)local_80);
    if (bVar1) {
      if ((result.addr_.a_._3_1_ & 1) == 0) {
        this_00 = gsl::not_null<pstore::array_stack<pstore::index::details::parent_type,_13UL>_*>::
                  operator->((not_null<pstore::array_stack<pstore::index::details::parent_type,_13UL>_*>
                              *)&this_local);
        existing_hash = (hash_type)parents_local.ptr_;
        details::parent_type::parent_type
                  (&local_b8,(index_pointer)parents_local.ptr_,0xffffffffffffffff);
        array_stack<pstore::index::details::parent_type,_13UL>::push(this_00,&local_b8);
        iStack_58.addr_.a_ = (address)(address)parents_local.ptr_;
      }
      else {
        local_a8 = this_local;
        local_a0[0] = store_leaf_node<std::pair<std::__cxx11::string,pstore::extent<char>>>
                                (this,(transaction_base *)value_local,
                                 (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>
                                  *)hash_local,
                                 (not_null<pstore::array_stack<pstore::index::details::parent_type,_13UL>_*>
                                  )this_local);
        details::index_pointer::operator=((index_pointer *)&stack0xffffffffffffffa8,local_a0);
      }
      existing_key.field_2._M_local_buf[0xf] = '\x01';
    }
    else {
      sVar2 = std::
              hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)(this + 0x28),(string *)local_80);
      local_c8 = sVar2 >> (result.addr_.a_._4_1_ & 0x3f);
      local_d8 = this_local;
      local_d0 = insert_into_leaf<std::pair<std::__cxx11::string,pstore::extent<char>>>
                           (this,(transaction_base *)value_local,(index_pointer *)&parents_local,
                            (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>
                             *)hash_local,local_c8,hStack_48,result.addr_.a_._4_4_,
                            (not_null<pstore::array_stack<pstore::index::details::parent_type,_13UL>_*>
                             )this_local);
      iStack_58 = local_d0;
    }
    std::__cxx11::string::~string((string *)local_80);
  }
  else {
    bVar1 = details::depth_is_internal_node(result.addr_.a_._4_4_);
    if (bVar1) {
      local_f0 = parents_local.ptr_;
      local_f8 = this_local;
      pVar3 = insert_into_internal<std::pair<std::__cxx11::string,pstore::extent<char>>>
                        (this,(transaction_base *)value_local,(index_pointer)parents_local.ptr_,
                         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>
                          *)hash_local,hStack_48,result.addr_.a_._4_4_,
                         (not_null<pstore::array_stack<pstore::index::details::parent_type,_13UL>_*>
                         )this_local,(bool)(result.addr_.a_._3_1_ & 1));
      local_108 = pVar3.first;
      local_100 = pVar3.second;
      local_e8 = local_108;
      local_e0 = local_100;
      std::tie<pstore::index::details::index_pointer,bool>
                (local_118,(bool *)&stack0xffffffffffffffa8);
      std::tuple<pstore::index::details::index_pointer&,bool&>::operator=
                ((tuple<pstore::index::details::index_pointer&,bool&> *)&local_118[0].addr_,
                 (pair<pstore::index::details::index_pointer,_bool> *)&local_e8.addr_);
    }
    else {
      local_130 = parents_local.ptr_;
      local_138 = this_local;
      pVar3 = insert_into_linear<std::pair<std::__cxx11::string,pstore::extent<char>>>
                        (this,(transaction_base *)value_local,(index_pointer)parents_local.ptr_,
                         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>
                          *)hash_local,
                         (not_null<pstore::array_stack<pstore::index::details::parent_type,_13UL>_*>
                         )this_local,(bool)(result.addr_.a_._3_1_ & 1));
      local_148 = pVar3.first;
      local_140 = pVar3.second;
      local_128 = local_148;
      local_120 = local_140;
      std::tie<pstore::index::details::index_pointer,bool>
                (local_158,(bool *)&stack0xffffffffffffffa8);
      std::tuple<pstore::index::details::index_pointer&,bool&>::operator=
                ((tuple<pstore::index::details::index_pointer&,bool&> *)&local_158[0].addr_,
                 (pair<pstore::index::details::index_pointer,_bool> *)&local_128.addr_);
    }
  }
  pVar3 = std::make_pair<pstore::index::details::index_pointer&,bool&>
                    (&stack0xffffffffffffffa8,(bool *)(existing_key.field_2._M_local_buf + 0xf));
  return pVar3;
}

Assistant:

auto hamt_map<KeyType, ValueType, Hash, KeyEqual>::insert_node (
            transaction_base & transaction, index_pointer const node, OtherValueType const & value,
            hash_type hash, unsigned shifts, gsl::not_null<parent_stack *> parents, bool is_upsert)
            -> std::pair<index_pointer, bool> {

            index_pointer result;
            bool key_exists = false;
            if (node.is_leaf ()) { // This node is a leaf node.
                key_type const existing_key =
                    get_key (transaction.db (), node.to_address ()); // Read key.
                if (equal_ (value.first, existing_key)) {
                    if (is_upsert) {
                        result = this->store_leaf_node (transaction, value, parents);
                    } else {
                        parents->push (details::parent_type{node});
                        result = node;
                    }
                    key_exists = true;
                } else {
                    auto const existing_hash =
                        static_cast<hash_type> ((hash_ (existing_key) >> shifts));
                    result = this->insert_into_leaf (transaction, node, value, existing_hash, hash,
                                                     shifts, parents);
                }
            } else {
                // This node is an internal or a linear node.
                if (details::depth_is_internal_node (shifts)) {
                    std::tie (result, key_exists) = this->insert_into_internal (
                        transaction, node, value, hash, shifts, parents, is_upsert);
                } else {
                    std::tie (result, key_exists) =
                        this->insert_into_linear (transaction, node, value, parents, is_upsert);
                }
            }

            return std::make_pair (result, key_exists);
        }